

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_span.h
# Opt level: O0

reference __thiscall S2PointLoopSpan::operator[](S2PointLoopSpan *this,int i)

{
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pVVar4;
  int local_80;
  int j;
  S2LogMessageVoidify local_2a;
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  S2PointLoopSpan *pSStack_10;
  int i_local;
  S2PointLoopSpan *this_local;
  
  local_29 = 0;
  local_14 = i;
  pSStack_10 = this;
  if (i < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_span.h"
               ,0x32,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar3 = S2LogMessage::stream(&local_28);
    poVar3 = std::operator<<(poVar3,"Check failed: (i) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar3);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  uVar1 = (ulong)local_14;
  sVar2 = absl::Span<const_Vector3<double>_>::size(&this->super_S2PointSpan);
  local_80 = local_14;
  if (sVar2 << 1 <= uVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&j,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_span.h"
               ,0x33,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream((S2LogMessage *)&j);
    poVar3 = std::operator<<(poVar3,"Check failed: (i) < (2 * size()) ");
    S2LogMessageVoidify::operator&(&local_2a,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&j);
  }
  sVar2 = absl::Span<const_Vector3<double>_>::size(&this->super_S2PointSpan);
  local_80 = local_80 - (int)sVar2;
  if (local_80 < 0) {
    local_80 = local_14;
  }
  pVVar4 = absl::Span<const_Vector3<double>_>::operator[](&this->super_S2PointSpan,(long)local_80);
  return pVVar4;
}

Assistant:

reference operator[](int i) const noexcept {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * size());
    int j = i - static_cast<int>(size());
    return S2PointSpan::operator[](j < 0 ? i : j);
  }